

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeData * __thiscall c4::yml::Parser::_append_key_val(Parser *this,csubstr val,flag_t val_quoted)

{
  pfn_error p_Var1;
  Tree *pTVar2;
  size_t i;
  size_t i_00;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  bool bVar6;
  NodeData *pNVar7;
  ulong uVar8;
  size_t ichild;
  type_bits more_flags;
  csubstr cVar9;
  char msg [49];
  size_t local_38;
  
  pNVar7 = Tree::_p(this->m_tree,this->m_state->node_id);
  if (((pNVar7->m_type).type & MAP) == NOTYPE) {
    builtin_strncpy(msg + 0x28,"ode_id))",9);
    builtin_strncpy(msg,"check failed: (m_tree->is_map(m_state->n",0x28);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_38 = cVar9.len;
    auVar5 = ZEXT1224(ZEXT412(0x790a) << 0x40);
    LVar4.name.str._0_4_ = (int)cVar9.str;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = cVar9.str._4_4_;
    LVar4.name.len = local_38;
    (*p_Var1)(msg,0x31,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar8 = (ulong)((this->m_state->flags & 0x400U) << 3);
  more_flags = uVar8 + 0x1000;
  if (val_quoted == 0) {
    more_flags = uVar8;
  }
  cVar9 = _consume_scalar(this);
  pTVar2 = this->m_tree;
  i = this->m_state->node_id;
  pNVar7 = Tree::_p(pTVar2,i);
  i_00 = pNVar7->m_last_child;
  if (i == 0xffffffffffffffff) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        pNVar7 = (NodeData *)(*pcVar3)();
        return pNVar7;
      }
    }
    msg._24_16_ = (undefined1  [16])
                  to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x4f;
    msg[9] = 'L';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_00234578)
              ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
  }
  pNVar7 = Tree::_p(pTVar2,i);
  if (((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) {
    bVar6 = Tree::is_root(pTVar2,i);
    if (!bVar6) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar3 = (code *)swi(3);
          pNVar7 = (NodeData *)(*pcVar3)();
          return pNVar7;
        }
      }
      msg._24_16_ = (undefined1  [16])
                    to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4e;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      (*(code *)PTR_error_impl_00234578)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  if (i_00 != 0xffffffffffffffff) {
    pNVar7 = Tree::_p(pTVar2,i_00);
    if (pNVar7->m_parent != i) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar3 = (code *)swi(3);
          pNVar7 = (NodeData *)(*pcVar3)();
          return pNVar7;
        }
      }
      msg._24_16_ = (undefined1  [16])
                    to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4d;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      (*(code *)PTR_error_impl_00234578)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  ichild = Tree::_claim(pTVar2);
  Tree::_set_hierarchy(pTVar2,ichild,i,i_00);
  Tree::to_keyval(this->m_tree,ichild,cVar9,val,more_flags);
  if ((this->m_key_tag).str != (char *)0x0 && (this->m_key_tag).len != 0) {
    pTVar2 = this->m_tree;
    cVar9 = normalize_tag(this->m_key_tag);
    Tree::set_key_tag(pTVar2,ichild,cVar9);
    (this->m_key_tag).str = (char *)0x0;
    (this->m_key_tag).len = 0;
  }
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar2 = this->m_tree;
    cVar9 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar2,ichild,cVar9);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  _write_key_anchor(this,ichild);
  _write_val_anchor(this,ichild);
  this->m_state->flags = this->m_state->flags & 0xffffffdf;
  pNVar7 = Tree::get(this->m_tree,ichild);
  return pNVar7;
}

Assistant:

NodeData* Parser::_append_key_val(csubstr val, flag_t val_quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_map(m_state->node_id));
    type_bits additional_flags = 0;
    if(m_state->flags & QSCL)
        additional_flags |= KEYQUO;
    if(val_quoted)
        additional_flags |= VALQUO;

    csubstr key = _consume_scalar();
    _c4dbgpf("append keyval: '{}' '{}' to parent id={} (level={}){}{}", key, val, m_state->node_id, m_state->level, (additional_flags & KEYQUO) ? " KEYQUO!" : "", (additional_flags & VALQUO) ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_keyval(nid, key, val, additional_flags);
    _c4dbgpf("append keyval: id={} key='{}' val='{}'", nid, m_tree->key(nid), m_tree->val(nid));
    if( ! m_key_tag.empty())
    {
        _c4dbgpf("append keyval[{}]: set key tag='{}' -> '{}'", nid, m_key_tag, normalize_tag(m_key_tag));
        m_tree->set_key_tag(nid, normalize_tag(m_key_tag));
        m_key_tag.clear();
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append keyval[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_key_anchor(nid);
    _write_val_anchor(nid);
    rem_flags(QMRK);
    return m_tree->get(nid);
}